

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O3

void MercuryJson::print_json(JsonValue *value,int indent)

{
  size_t sVar1;
  long lVar2;
  JsonArray *pJVar3;
  char *pcVar4;
  JsonObject *pJVar5;
  
  switch(value->type) {
  case TYPE_NULL:
    pcVar4 = "null";
    goto LAB_0010d5b5;
  case TYPE_BOOL:
    if ((value->field_1).boolean != true) {
      pcVar4 = "false";
      lVar2 = 5;
      goto LAB_0010d639;
    }
    pcVar4 = "true";
LAB_0010d5b5:
    lVar2 = 4;
    goto LAB_0010d639;
  case TYPE_STR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
    pcVar4 = (value->field_1).str;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x120208);
    }
    else {
      sVar1 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar1);
    }
    pcVar4 = "\"";
    break;
  case TYPE_OBJ:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    pJVar5 = (value->field_1).object;
    if (pJVar5 != (JsonObject *)0x0) {
      do {
        print_indent(indent + 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
        pcVar4 = pJVar5->key;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x120208);
        }
        else {
          sVar1 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\": ",3);
        print_json(pJVar5->value,indent + 2);
        if (pJVar5->next != (JsonObject *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        pJVar5 = pJVar5->next;
      } while (pJVar5 != (JsonObject *)0x0);
    }
    print_indent(indent);
    pcVar4 = "}";
    break;
  case TYPE_ARR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    pJVar3 = (value->field_1).array;
    if (pJVar3 != (JsonArray *)0x0) {
      do {
        print_indent(indent + 2);
        print_json(pJVar3->value,indent + 2);
        if (pJVar3->next != (JsonArray *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        pJVar3 = pJVar3->next;
      } while (pJVar3 != (JsonArray *)0x0);
    }
    print_indent(indent);
    pcVar4 = "]";
    break;
  case TYPE_INT:
    std::ostream::_M_insert<long_long>((longlong)&std::cout);
    return;
  case TYPE_DEC:
    std::ostream::_M_insert<double>((value->field_1).decimal);
    return;
  default:
    return;
  }
  lVar2 = 1;
LAB_0010d639:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar2);
  return;
}

Assistant:

void print_json(JsonValue *value, int indent) {
        int cnt;
        switch (value->type) {
            case JsonValue::TYPE_NULL:
                std::cout << "null";
                break;
            case JsonValue::TYPE_BOOL:
                if (value->boolean) std::cout << "true";
                else std::cout << "false";
                break;
            case JsonValue::TYPE_STR:
                std::cout << "\"" << value->str << "\"";
                break;
            case JsonValue::TYPE_OBJ:
                std::cout << "{" << std::endl;
                cnt = 0;
                for (auto *elem = value->object; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    std::cout << "\"" << elem->key << "\": ";
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "}";
                break;
            case JsonValue::TYPE_ARR:
                std::cout << "[" << std::endl;
                cnt = 0;
                for (auto *elem = value->array; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "]";
                break;
            case JsonValue::TYPE_INT:
                std::cout << value->integer;
                break;
            case JsonValue::TYPE_DEC:
                std::cout << value->decimal;
                break;
        }
    }